

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  long lVar3;
  long lVar4;
  TargetType TVar5;
  char *pcVar6;
  char *__s;
  long *plVar7;
  size_t sVar8;
  long *plVar9;
  ArtifactType artifact_00;
  string langPrefix;
  size_type __dnew;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined6 uStack_3e;
  
  TVar5 = cmTarget::GetType(this->Target);
  if (TVar5 == STATIC_LIBRARY) {
LAB_00282e15:
    paVar1 = &local_90.field_2;
    if (artifact == ImportLibraryArtifact) {
      pcVar2 = this->Makefile;
      local_70 = (long *)0x1b;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      local_90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
      local_90.field_2._M_allocated_capacity._0_4_ = SUB84(local_70,0);
      local_90.field_2._M_local_buf[4] = (char)((ulong)local_70 >> 0x20);
      local_90.field_2._M_local_buf[5] = (char)((ulong)local_70 >> 0x28);
      local_90.field_2._M_local_buf[6] = (char)((ulong)local_70 >> 0x30);
      local_90.field_2._M_local_buf[7] = (char)((ulong)local_70 >> 0x38);
      builtin_strncpy(local_90._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
      local_90._M_string_length = (size_type)local_70;
      local_90._M_dataplus._M_p[(long)local_70] = '\0';
      pcVar6 = cmMakefile::GetDefinition(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT17(local_90.field_2._M_local_buf[7],
                                 CONCAT16(local_90.field_2._M_local_buf[6],
                                          CONCAT15(local_90.field_2._M_local_buf[5],
                                                   CONCAT14(local_90.field_2._M_local_buf[4],
                                                            local_90.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if (pcVar6 == (char *)0x0) goto LAB_00282fd9;
    }
    TVar5 = cmTarget::GetType(this->Target);
    artifact_00 = artifact;
    if (TVar5 != SHARED_LIBRARY) {
      TVar5 = cmTarget::GetType(this->Target);
      if (TVar5 != MODULE_LIBRARY) {
        TVar5 = cmTarget::GetType(this->Target);
        artifact_00 = RuntimeBinaryArtifact;
        if (TVar5 == EXECUTABLE) {
          artifact_00 = artifact;
        }
      }
    }
    if (artifact == ImportLibraryArtifact) {
      local_90.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
      local_90.field_2._M_local_buf[4] = 'R';
      local_90.field_2._M_local_buf[5] = 'T';
      local_90.field_2._M_local_buf[6] = '_';
      local_90.field_2._M_local_buf[7] = 'P';
      local_90.field_2._8_5_ = 0x5849464552;
      local_90._M_string_length = 0xd;
      local_90.field_2._M_local_buf[0xd] = '\0';
      local_90._M_dataplus._M_p = (pointer)paVar1;
      pcVar6 = GetProperty(this,&local_90);
    }
    else {
      local_90.field_2._M_allocated_capacity._0_4_ = 0x46455250;
      local_90.field_2._M_local_buf[4] = 'I';
      local_90.field_2._M_local_buf[5] = 'X';
      local_90._M_string_length = 6;
      local_90.field_2._M_local_buf[6] = '\0';
      local_90._M_dataplus._M_p = (pointer)paVar1;
      pcVar6 = GetProperty(this,&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               CONCAT16(local_90.field_2._M_local_buf[6],
                                        CONCAT15(local_90.field_2._M_local_buf[5],
                                                 CONCAT14(local_90.field_2._M_local_buf[4],
                                                          local_90.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    if (pcVar6 == (char *)0x0) {
      __s = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
      pcVar6 = (char *)0x0;
      if ((__s != (char *)0x0) && (language->_M_string_length != 0)) {
        if (*__s == '\0') {
          pcVar6 = (char *)0x0;
        }
        else {
          local_40 = 0x5f;
          local_48 = 1;
          local_50 = &local_40;
          strlen(__s);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)__s);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_60 = *plVar9;
            lStack_58 = plVar7[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar9;
            local_70 = (long *)*plVar7;
          }
          local_68 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)(language->_M_dataplus)._M_p);
          plVar9 = plVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar9) {
            lVar3 = *plVar9;
            lVar4 = plVar7[3];
            local_90.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
            local_90.field_2._M_local_buf[4] = (char)((ulong)lVar3 >> 0x20);
            local_90.field_2._M_local_buf[5] = (char)((ulong)lVar3 >> 0x28);
            local_90.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
            local_90.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
            local_90.field_2._8_5_ = (undefined5)lVar4;
            local_90.field_2._M_local_buf[0xd] = (char)((ulong)lVar4 >> 0x28);
            local_90.field_2._14_2_ = (undefined2)((ulong)lVar4 >> 0x30);
            local_90._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            lVar3 = *plVar9;
            local_90.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
            local_90.field_2._M_local_buf[4] = (char)((ulong)lVar3 >> 0x20);
            local_90.field_2._M_local_buf[5] = (char)((ulong)lVar3 >> 0x28);
            local_90.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
            local_90.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
            local_90._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_90._M_string_length = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT62(uStack_3e,local_40) + 1);
          }
          pcVar6 = cmMakefile::GetDefinition(this->Makefile,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT17(local_90.field_2._M_local_buf[7],
                                     CONCAT16(local_90.field_2._M_local_buf[6],
                                              CONCAT15(local_90.field_2._M_local_buf[5],
                                                       CONCAT14(local_90.field_2._M_local_buf[4],
                                                                local_90.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
        }
      }
      if (pcVar6 == (char *)0x0 && __s != (char *)0x0) {
        pcVar2 = this->Makefile;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar8);
        pcVar6 = cmMakefile::GetDefinition(pcVar2,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT17(local_90.field_2._M_local_buf[7],
                                   CONCAT16(local_90.field_2._M_local_buf[6],
                                            CONCAT15(local_90.field_2._M_local_buf[5],
                                                     CONCAT14(local_90.field_2._M_local_buf[4],
                                                              local_90.field_2._M_allocated_capacity
                                                              ._0_4_)))) + 1);
        }
      }
    }
  }
  else {
    TVar5 = cmTarget::GetType(this->Target);
    if (TVar5 == SHARED_LIBRARY) goto LAB_00282e15;
    TVar5 = cmTarget::GetType(this->Target);
    if (TVar5 == MODULE_LIBRARY) goto LAB_00282e15;
    TVar5 = cmTarget::GetType(this->Target);
    if (TVar5 == EXECUTABLE) goto LAB_00282e15;
LAB_00282fd9:
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

const char* cmGeneratorTarget::GetFilePrefixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + language;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}